

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlSAXParseFileWithData(xmlSAXHandlerPtr sax,char *filename,int recovery,void *data)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  pxVar1 = (xmlDocPtr)0x0;
  ctxt = xmlNewSAXParserCtxt(sax,(void *)0x0);
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if (data != (void *)0x0) {
      ctxt->_private = data;
    }
    if (recovery != 0) {
      *(byte *)&ctxt->options = (byte)ctxt->options | 1;
      ctxt->recovery = 1;
    }
    if (((filename == (char *)0x0) || (*filename != '-')) || (filename[1] != '\0')) {
      input = xmlCtxtNewInputFromUrl(ctxt,filename,(char *)0x0,(char *)0x0,0);
    }
    else {
      input = xmlCtxtNewInputFromFd(ctxt,filename,0,(char *)0x0,0);
    }
    if (input == (xmlParserInputPtr)0x0) {
      pxVar1 = (xmlDocPtr)0x0;
    }
    else {
      pxVar1 = xmlCtxtParseDocument(ctxt,input);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return pxVar1;
}

Assistant:

xmlDocPtr
xmlSAXParseFileWithData(xmlSAXHandlerPtr sax, const char *filename,
                        int recovery, void *data) {
    xmlDocPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL)
	return(NULL);

    if (data != NULL)
	ctxt->_private = data;

    if (recovery) {
        ctxt->options |= XML_PARSE_RECOVER;
        ctxt->recovery = 1;
    }

    if ((filename != NULL) && (filename[0] == '-') && (filename[1] == 0))
        input = xmlCtxtNewInputFromFd(ctxt, filename, STDIN_FILENO, NULL, 0);
    else
        input = xmlCtxtNewInputFromUrl(ctxt, filename, NULL, NULL, 0);

    if (input != NULL)
        ret = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}